

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

ip_rule_t * parse_rule(char *str,ip_table_t *ipt)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  ip_rule_t *ipr_00;
  size_t sVar4;
  ip_chain_t *piVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double __x;
  ip_rule_t *ipr;
  ip_match_t *ipm;
  int inv_type;
  int invert;
  char *q;
  char *p;
  ip_table_t *ipt_local;
  char *str_local;
  
  q = (char *)0x0;
  _inv_type = (char *)0x0;
  ipm._4_4_ = 0;
  ipr = (ip_rule_t *)0x0;
  p = (char *)ipt;
  ipt_local = (ip_table_t *)str;
  ipr_00 = (ip_rule_t *)new(0x70);
  ipr_00->target = 6;
  INIT_LIST_HEAD(&ipr_00->list);
  INIT_LIST_HEAD(&ipr_00->matchs);
  q = strtok((char *)ipt_local," \t\n");
  do {
    bVar2 = 0;
    if (q == (char *)0x0) {
      return ipr_00;
    }
    _inv_type = q;
    if ((*q == '!') && (q[1] == '\0')) {
      ipm._4_4_ = 1;
    }
    else if (*q == '-') {
      if (((q[1] != 'f') && (q[1] != '-')) &&
         (_inv_type = strtok((char *)0x0," \t\n"), __x = extraout_XMM0_Qa, _inv_type == (char *)0x0)
         ) goto LAB_001043ea;
      switch(q[1]) {
      case '-':
        if (((ipr != (ip_rule_t *)0x0) && (ipr->chain != (ip_chain_t *)0x0)) &&
           (*(long *)(ipr->chain->name + 0x18) != 0)) {
          uVar1._0_4_ = ipr->src;
          uVar1._4_4_ = ipr->dst;
          iVar3 = (**(code **)(ipr->chain->name + 0x18))(uVar1,&inv_type,ipm._4_4_);
          __x = extraout_XMM0_Qa_10;
joined_r0x001042e0:
          if (iVar3 != 0) {
LAB_001043ea:
            _log(__x);
            free_rule(ipr_00);
            return (ip_rule_t *)0x0;
          }
        }
        break;
      default:
        break;
      case 'A':
        piVar5 = find_chain(_inv_type,(ip_table_t *)p);
        ipr_00->chain = piVar5;
        __x = extraout_XMM0_Qa_00;
        if (ipr_00->chain == (ip_chain_t *)0x0) goto LAB_001043ea;
        list_add_tail(&ipr_00->list,&ipr_00->chain->rules);
        break;
      case 'd':
        iVar3 = parse_ip(_inv_type,&ipr_00->dst,&ipr_00->dmsk);
        __x = extraout_XMM0_Qa_02;
        if (iVar3 != 0) goto LAB_001043ea;
        bVar2 = 2;
        break;
      case 'f':
        ipr_00->frag = '\x01';
        bVar2 = 0x20;
        break;
      case 'g':
        piVar5 = find_chain(_inv_type,(ip_table_t *)p);
        ipr_00->target_child = piVar5;
        __x = extraout_XMM0_Qa_08;
        if (piVar5 == (ip_chain_t *)0x0) goto LAB_001043ea;
        ipr_00->target = 5;
        ipr_00->go = '\x01';
        break;
      case 'i':
        sVar4 = strlen(_inv_type);
        __x = extraout_XMM0_Qa_03;
        if (0xf < sVar4) goto LAB_001043ea;
        _strlcpy(ipr_00->in,_inv_type,0x10);
        bVar2 = 4;
        break;
      case 'j':
        iVar3 = parse_target(_inv_type,ipr_00,(ip_table_t *)p);
        __x = extraout_XMM0_Qa_06;
        if (iVar3 != 0) goto LAB_001043ea;
        if (((ipr_00->target == 4) && (ipr_00->target_ext != (ip_target_t *)0x0)) &&
           ((ipr_00->target_ext->map != (ip_target_map_t *)0x0 &&
            (ipr_00->target_ext->map->func_parse != (_func_int_void_ptr_char_ptr_ptr *)0x0)))) {
          iVar3 = (*ipr_00->target_ext->map->func_parse)
                            (ipr_00->target_ext->data,(char **)&inv_type);
          __x = extraout_XMM0_Qa_07;
          goto joined_r0x001042e0;
        }
        break;
      case 'm':
        ipr = (ip_rule_t *)parse_match(_inv_type,ipr_00);
        __x = extraout_XMM0_Qa_09;
        if (ipr == (ip_rule_t *)0x0) goto LAB_001043ea;
        break;
      case 'o':
        sVar4 = strlen(_inv_type);
        __x = extraout_XMM0_Qa_04;
        if (0xf < sVar4) goto LAB_001043ea;
        _strlcpy(ipr_00->out,_inv_type,0x10);
        bVar2 = 8;
        break;
      case 'p':
        iVar3 = parse_proto(_inv_type,&ipr_00->proto);
        __x = extraout_XMM0_Qa_05;
        if (iVar3 != 0) goto LAB_001043ea;
        bVar2 = 0x10;
        break;
      case 's':
        iVar3 = parse_ip(_inv_type,&ipr_00->src,&ipr_00->smsk);
        __x = extraout_XMM0_Qa_01;
        if (iVar3 != 0) goto LAB_001043ea;
        bVar2 = 1;
      }
      if (((ipm._4_4_ != 0) && (bVar2 != 0)) && (ipr_00 != (ip_rule_t *)0x0)) {
        ipr_00->invert = ipr_00->invert | bVar2;
      }
      ipm._4_4_ = 0;
    }
    q = _inv_type;
    q = strtok((char *)0x0," \t\n");
  } while( true );
}

Assistant:

static ip_rule_t *parse_rule(char *str, ip_table_t *ipt)
{
	char *p = NULL, *q = NULL;
	int invert = 0, inv_type = 0;
	ip_match_t *ipm = NULL;
	ip_rule_t *ipr = _new(ip_rule_t);

	ipr->target = TARGET_NONE;
	INIT_LIST_HEAD(&ipr->list);
	INIT_LIST_HEAD(&ipr->matchs);

	for (p = strtok(str, " \t\n"); p; p = strtok(NULL, " \t\n")) {
		q = p;

		if (p[0] == '!' && p[1] == '\0') {
			invert = 1;
		} else if (p[0] == '-') {

			if (p[1] != 'f' && p[1] != '-') {

				if ((q = strtok(NULL, " \t\n")) == NULL) {
					goto err;
				}
			}

			switch (p[1]) {
				case 'A' :
					ipr->chain = find_chain(q, ipt);
					if (ipr->chain) {
						list_add_tail(&ipr->list, &ipr->chain->rules);
					} else {
						goto err;
					}
					break;

				case 's' :
					if (parse_ip(q, &ipr->src, &ipr->smsk) != 0) {
						goto err;
					}
					inv_type = INV_SRC;
					break;

				case 'd' :
					if (parse_ip(q, &ipr->dst, &ipr->dmsk) != 0) {
						goto err;
					}
					inv_type = INV_DST;
					break;

				case 'i' :
					if (strlen(q) < MAX_IFACE_LEN) {
						_strlcpy(ipr->in, q, sizeof(ipr->in));
					} else {
						goto err;
					}
					inv_type = INV_IN;
					break;

				case 'o' :
					if (strlen(q) < MAX_IFACE_LEN) {
						_strlcpy(ipr->out, q, sizeof(ipr->out));
					} else {
						goto err;
					}
					inv_type = INV_OUT;
					break;

				case 'p' :
					if (parse_proto(q, &ipr->proto) != 0) {
						goto err;
					}
					inv_type = INV_PROTO;
					break;

				case 'f' :
					ipr->frag = 1;
					inv_type = INV_FRAG;
					break;

				case 'j' :
					if (parse_target(q, ipr, ipt) != 0) {
						goto err;
					}

					if (ipr->target == TARGET_EXT && ipr->target_ext &&
						ipr->target_ext->map && ipr->target_ext->map->func_parse) {
						if (ipr->target_ext->map->func_parse(ipr->target_ext->data, &q) != 0) {
							goto err;
						}
					}

					break;

				case 'g' :

					if ((ipr->target_child = find_chain(q, ipt)) != NULL) {
						ipr->target = TARGET_CHILD;
						ipr->go = 1;
					} else {
						goto err;
					}

					break;

				case 'm' :
					ipm = parse_match(q, ipr);

					if (ipm == NULL) {
						goto err;
					}

					break;

				case '-' :
					if (ipm && ipm->map && ipm->map->func_parse) {
						if (ipm->map->func_parse(ipm->data, &q, invert) != 0) {
							goto err;
						}
					}

					break;

				default :
					break;
			}

			if (invert && inv_type && ipr) {
				ipr->invert |= inv_type;
			}

			inv_type = 0;
			invert = 0;

		}

		p = q;
	}

	return ipr;
err:
	log_err("rule \"%s\" is invaild\n", p);
	free_rule(ipr);
	return NULL;
}